

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes31Context.cpp
# Opt level: O1

void __thiscall deqp::gles31::Context::createRenderContext(Context *this)

{
  RenderContext *pRVar1;
  ContextInfo *pCVar2;
  
  pRVar1 = glu::createDefaultRenderContext
                     (this->m_testCtx->m_platform,this->m_testCtx->m_cmdLine,(ApiType)0x23);
  this->m_renderCtx = pRVar1;
  pCVar2 = glu::ContextInfo::create(this->m_renderCtx);
  this->m_contextInfo = pCVar2;
  return;
}

Assistant:

void Context::createRenderContext (void)
{
	DE_ASSERT(!m_renderCtx && !m_contextInfo);

	try
	{
		try
		{
			m_renderCtx		= glu::createDefaultRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), glu::ApiType::es(3, 2));
		}
		catch (...)
		{
			m_renderCtx		= glu::createDefaultRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), glu::ApiType::es(3, 1));
		}
		m_contextInfo	= glu::ContextInfo::create(*m_renderCtx);
	}
	catch (...)
	{
		destroyRenderContext();
		throw;
	}
}